

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

Value * __thiscall
cmFileAPI::MaybeJsonFile(Value *__return_storage_ptr__,cmFileAPI *this,Value *in,string *prefix)

{
  bool bVar1;
  Value *this_00;
  string local_70;
  Value local_50;
  
  Json::Value::Value(__return_storage_ptr__,nullValue);
  bVar1 = Json::Value::isObject(in);
  if ((!bVar1) && (bVar1 = Json::Value::isArray(in), !bVar1)) {
    Json::Value::operator=(__return_storage_ptr__,in);
    return __return_storage_ptr__;
  }
  Json::Value::Value(&local_50,objectValue);
  Json::Value::operator=(__return_storage_ptr__,&local_50);
  Json::Value::~Value(&local_50);
  WriteJsonFile(&local_70,this,in,prefix,ComputeSuffixHash);
  Json::Value::Value(&local_50,&local_70);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"jsonFile");
  Json::Value::operator=(this_00,&local_50);
  Json::Value::~Value(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::MaybeJsonFile(Json::Value in, std::string const& prefix)
{
  Json::Value out;
  if (in.isObject() || in.isArray()) {
    out = Json::objectValue;
    out["jsonFile"] = this->WriteJsonFile(in, prefix);
  } else {
    out = std::move(in);
  }
  return out;
}